

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O1

string * FIX::socket_get_last_error_abi_cxx11_(void)

{
  int __errnum;
  int *piVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  string *in_RDI;
  stringstream errorMessage;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  piVar1 = __errno_location();
  __errnum = *piVar1;
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Winsock error ",0xe);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_198,__errnum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  __s = strerror(__errnum);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return in_RDI;
}

Assistant:

std::string socket_get_last_error() {
  std::stringstream errorMessage;
#ifdef _MSC_VER
  int winsockErrorCode = WSAGetLastError();

  char *s = NULL;
  FormatMessageA(
      FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS,
      NULL,
      winsockErrorCode,
      MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
      (LPSTR)&s,
      0,
      NULL);
  errorMessage << "Winsock error " << winsockErrorCode << ": " << s;
  LocalFree(s);
#else
  int errorNumber = errno;
  errorMessage << "Winsock error " << errorNumber << ": " << strerror(errorNumber);
#endif
  return errorMessage.str();
}